

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamFtp::~BamFtp(BamFtp *this)

{
  void *pvVar1;
  long *in_RDI;
  TcpSocket *in_stack_ffffffffffffffe0;
  TcpSocket *this_00;
  
  *in_RDI = (long)&PTR__BamFtp_002109c0;
  (**(code **)(*in_RDI + 0x10))();
  if ((in_RDI[6] != 0) && (pvVar1 = (void *)in_RDI[6], pvVar1 != (void *)0x0)) {
    TcpSocket::~TcpSocket(in_stack_ffffffffffffffe0);
    operator_delete(pvVar1);
  }
  if ((in_RDI[7] != 0) && (this_00 = (TcpSocket *)in_RDI[7], this_00 != (TcpSocket *)0x0)) {
    TcpSocket::~TcpSocket(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x1e));
  std::__cxx11::string::~string((string *)(in_RDI + 0x1a));
  std::__cxx11::string::~string((string *)(in_RDI + 0x16));
  std::__cxx11::string::~string((string *)(in_RDI + 0x12));
  std::__cxx11::string::~string((string *)(in_RDI + 0xd));
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  IBamIODevice::~IBamIODevice((IBamIODevice *)0x1c9ac2);
  return;
}

Assistant:

BamFtp::~BamFtp(void) {

    // close connection & clean up
    Close();
    if ( m_commandSocket )
        delete m_commandSocket;
    if ( m_dataSocket )
        delete m_dataSocket;
}